

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O0

void __thiscall YAML::NodeBuilder::Push(NodeBuilder *this,node *node)

{
  bool bVar1;
  value vVar2;
  value_type pnVar3;
  vector<std::pair<YAML::detail::node_*,_bool>,_std::allocator<std::pair<YAML::detail::node_*,_bool>_>_>
  *in_RSI;
  value_type *in_RDI;
  bool needsKey;
  uint6 in_stack_ffffffffffffffd0;
  bool bVar4;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffd7;
  vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *in_stack_ffffffffffffffe0;
  vector<std::pair<YAML::detail::node_*,_bool>,_std::allocator<std::pair<YAML::detail::node_*,_bool>_>_>
  *this_00;
  
  bVar1 = std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::empty
                    (in_stack_ffffffffffffffe0);
  bVar4 = false;
  if (!bVar1) {
    std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::back
              ((vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *)
               CONCAT17(in_stack_ffffffffffffffd7,(uint7)in_stack_ffffffffffffffd0));
    vVar2 = detail::node::type((node *)0xf0c512);
    bVar4 = false;
    if (vVar2 == Map) {
      pnVar3 = (value_type)
               std::
               vector<std::pair<YAML::detail::node_*,_bool>,_std::allocator<std::pair<YAML::detail::node_*,_bool>_>_>
               ::size((vector<std::pair<YAML::detail::node_*,_bool>,_std::allocator<std::pair<YAML::detail::node_*,_bool>_>_>
                       *)(in_RDI + 10));
      bVar4 = pnVar3 < in_RDI[0xd];
    }
  }
  uVar5 = bVar4;
  this_00 = in_RSI;
  std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::push_back
            ((vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *)
             CONCAT17(in_stack_ffffffffffffffd7,CONCAT16(bVar4,in_stack_ffffffffffffffd0)),in_RDI);
  if (bVar4 != false) {
    std::
    vector<std::pair<YAML::detail::node*,bool>,std::allocator<std::pair<YAML::detail::node*,bool>>>
    ::emplace_back<YAML::detail::node*,bool>
              (this_00,(node **)in_RSI,(bool *)(ulong)CONCAT16(uVar5,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void NodeBuilder::Push(detail::node& node) {
  const bool needsKey =
      (!m_stack.empty() && m_stack.back()->type() == NodeType::Map &&
       m_keys.size() < m_mapDepth);

  m_stack.push_back(&node);
  if (needsKey)
    m_keys.emplace_back(&node, false);
}